

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O0

void __thiscall pawn_table::pawn_table(pawn_table *this,pawn_table *o)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  pawn_entry *__p;
  element_type *__dest;
  element_type *__src;
  pawn_entry *local_68;
  shared_ptr<pawn_entry[]> local_28;
  pawn_table *local_18;
  pawn_table *o_local;
  pawn_table *this_local;
  
  this->sz_mb = 0;
  this->count = 0;
  local_18 = o;
  o_local = this;
  std::shared_ptr<pawn_entry[]>::shared_ptr(&this->entries);
  uVar1 = this->count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x128),0);
  if (SUB168(auVar2 * ZEXT816(0x128),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (pawn_entry *)operator_new__(uVar3);
  if (uVar1 != 0) {
    local_68 = __p;
    do {
      pawn_entry::pawn_entry(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != __p + uVar1);
  }
  std::shared_ptr<pawn_entry[]>::shared_ptr<pawn_entry,void>(&local_28,__p);
  std::shared_ptr<pawn_entry[]>::operator=(&this->entries,&local_28);
  std::shared_ptr<pawn_entry[]>::~shared_ptr(&local_28);
  __dest = std::__shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>)
  ;
  __src = std::__shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>::get
                    (&(local_18->entries).
                      super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>);
  memcpy(__dest,__src,this->count * 0x128);
  this->sz_mb = local_18->sz_mb;
  this->count = local_18->count;
  return;
}

Assistant:

pawn_table::pawn_table(const pawn_table& o) {
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(pawn_entry));
	sz_mb = o.sz_mb;
	count = o.count;
}